

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAssemblerLabel.cpp
# Opt level: O0

void __thiscall CDirectiveFunction::writeTempData(CDirectiveFunction *this,TempData *tempData)

{
  pointer pCVar1;
  pointer pCVar2;
  TempData *tempData_local;
  CDirectiveFunction *this_local;
  
  pCVar1 = std::unique_ptr<CAssemblerLabel,_std::default_delete<CAssemblerLabel>_>::operator->
                     (&this->label);
  (*(pCVar1->super_CAssemblerCommand)._vptr_CAssemblerCommand[4])(pCVar1,tempData);
  pCVar2 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                     (&this->content);
  CAssemblerCommand::applyFileInfo(pCVar2);
  pCVar2 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                     (&this->content);
  (*pCVar2->_vptr_CAssemblerCommand[4])(pCVar2,tempData);
  return;
}

Assistant:

void CDirectiveFunction::writeTempData(TempData& tempData) const
{
	label->writeTempData(tempData);
	content->applyFileInfo();
	content->writeTempData(tempData);
}